

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesBoolWidget.cxx
# Opt level: O3

bool __thiscall
cmCursesBoolWidget::HandleInput
          (cmCursesBoolWidget *this,int *key,cmCursesMainForm *param_2,WINDOW *w)

{
  bool bVar1;
  int iVar2;
  
  if ((*key == 0x157) || (*key == 10)) {
    iVar2 = std::__cxx11::string::compare((char *)&(this->super_cmCursesWidget).Value);
    SetValueAsBool(this,iVar2 != 0);
    if (w == (WINDOW *)0x0) {
      iVar2 = -1;
    }
    else {
      iVar2 = w->_maxy + 1;
    }
    wtouchln(w,0,iVar2,1);
    wrefresh(w);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmCursesBoolWidget::HandleInput(int& key, cmCursesMainForm*, WINDOW* w)
{

  // 10 == enter
  if (key == 10 || key == KEY_ENTER)
    {
    if (this->GetValueAsBool())
      {
      this->SetValueAsBool(false);
      }
    else
      {
      this->SetValueAsBool(true);
      }

    touchwin(w);
    wrefresh(w);
    return true;
    }
  else
    {
    return false;
    }

}